

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O1

void __thiscall Assimp::ZipArchiveIOSystem::Implement::MapArchive(Implement *this)

{
  int iVar1;
  string filename_string;
  unz_file_info fileInfo;
  char filename [256];
  string local_1f8;
  ZipFileInfo local_1d8;
  undefined1 local_1c0 [56];
  size_t local_188;
  long local_180;
  undefined1 local_138 [264];
  
  if ((this->m_ZipFileHandle != (unzFile)0x0) &&
     ((this->m_ArchiveMap)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    iVar1 = unzGoToFirstFile();
    if (iVar1 == 0) {
      do {
        iVar1 = unzGetCurrentFileInfo(this->m_ZipFileHandle,local_1c0,local_138,0x100,0,0,0,0);
        if ((iVar1 == 0) && (local_188 != 0)) {
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f8,local_138,local_138 + local_180);
          SimplifyFilename(&local_1f8);
          ZipFileInfo::ZipFileInfo(&local_1d8,this->m_ZipFileHandle,local_188);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>>>
          ::_M_emplace_unique<std::__cxx11::string&,Assimp::ZipFileInfo>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>>>
                      *)&this->m_ArchiveMap,&local_1f8,&local_1d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p);
          }
        }
        iVar1 = unzGoToNextFile(this->m_ZipFileHandle);
      } while (iVar1 != -100);
    }
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::MapArchive() {
        if (m_ZipFileHandle == nullptr)
            return;

        if (!m_ArchiveMap.empty())
            return;

        //  At first ensure file is already open
        if (unzGoToFirstFile(m_ZipFileHandle) != UNZ_OK)
            return;

        // Loop over all files
        do {
            char filename[FileNameSize];
            unz_file_info fileInfo;

            if (unzGetCurrentFileInfo(m_ZipFileHandle, &fileInfo, filename, FileNameSize, nullptr, 0, nullptr, 0) == UNZ_OK) {
                if (fileInfo.uncompressed_size != 0) {
                    std::string filename_string(filename, fileInfo.size_filename);
                    SimplifyFilename(filename_string);
                    m_ArchiveMap.emplace(filename_string, ZipFileInfo(m_ZipFileHandle, fileInfo.uncompressed_size));
                }
            }
        } while (unzGoToNextFile(m_ZipFileHandle) != UNZ_END_OF_LIST_OF_FILE);
    }